

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.cpp
# Opt level: O3

bool __thiscall
stream::slice_reader::open_file_case_insensitive
          (slice_reader *this,path_type *dirname,path_type *filename)

{
  long lVar1;
  long lVar2;
  pointer pcVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  _Alloc_hider _Var6;
  pointer pcVar7;
  size_type sVar8;
  size_type sVar9;
  long lVar10;
  directory_iterator i;
  directory_iterator end;
  path p;
  path_type actual_filename;
  directory_iterator local_b0;
  locale local_a8 [8];
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_a0;
  long *local_98 [2];
  long local_88 [2];
  path local_78;
  path_type *local_58;
  slice_reader *local_50;
  path_type *local_48;
  size_type local_40;
  size_type local_38;
  
  local_a0.px = (dir_itr_imp *)0x0;
  local_50 = this;
  local_48 = dirname;
  boost::filesystem::directory_iterator::directory_iterator(&local_b0,dirname,none);
  local_58 = filename;
  do {
    if ((local_b0.m_imp.px == (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)local_a0.px) ||
       (((local_b0.m_imp.px == (dir_itr_imp *)0x0 ||
         (*(long *)((long)local_b0.m_imp.px + 0x38) == 0)) &&
        ((local_a0.px == (dir_itr_imp *)0x0 || (*(long *)(local_a0.px + 0x38) == 0)))))) {
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_b0.m_imp);
      bVar5 = false;
LAB_0014ef81:
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_a0);
      return bVar5;
    }
    boost::filesystem::path::filename();
    std::locale::locale(local_a8);
    std::locale::locale((locale *)local_98,local_a8);
    _Var4._M_p = local_78.m_pathname._M_dataplus._M_p;
    pcVar3 = (filename->m_pathname)._M_dataplus._M_p;
    sVar8 = (filename->m_pathname)._M_string_length;
    _Var6._M_p = local_78.m_pathname._M_dataplus._M_p;
    pcVar7 = pcVar3;
    sVar9 = local_78.m_pathname._M_string_length;
    if (sVar8 != 0 && local_78.m_pathname._M_string_length != 0) {
      local_40 = local_78.m_pathname._M_string_length;
      lVar1 = local_78.m_pathname._M_string_length - 1;
      lVar10 = 0;
      local_38 = sVar8;
      do {
        bVar5 = boost::algorithm::is_iequal::operator()
                          ((is_iequal *)local_98,_Var4._M_p + lVar10,pcVar3 + lVar10);
        if (!bVar5) {
          std::locale::~locale((locale *)local_98);
          filename = local_58;
          goto LAB_0014ef2d;
        }
        lVar2 = lVar10 + 1;
      } while ((lVar1 != lVar10) && (bVar5 = sVar8 - 1 != lVar10, lVar10 = lVar2, bVar5));
      pcVar7 = pcVar3 + lVar2;
      _Var6._M_p = _Var4._M_p + lVar2;
      sVar8 = local_38;
      sVar9 = local_40;
      filename = local_58;
    }
    std::locale::~locale((locale *)local_98);
    if (pcVar3 + sVar8 == pcVar7 && _Var4._M_p + sVar9 == _Var6._M_p) {
      local_98[0] = local_88;
      pcVar7 = (local_48->m_pathname)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_98,pcVar7,pcVar7 + (local_48->m_pathname)._M_string_length);
      boost::filesystem::path::operator/=((path *)local_98,&local_78);
      bVar5 = open_file(local_50,(path_type *)local_98);
      if (local_98[0] != local_88) {
        operator_delete(local_98[0],local_88[0] + 1);
      }
    }
    else {
LAB_0014ef2d:
      bVar5 = false;
    }
    std::locale::~locale(local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.m_pathname._M_dataplus._M_p != &local_78.m_pathname.field_2) {
      operator_delete(local_78.m_pathname._M_dataplus._M_p,
                      local_78.m_pathname.field_2._M_allocated_capacity + 1);
    }
    if (bVar5 != false) {
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_b0.m_imp);
      bVar5 = true;
      goto LAB_0014ef81;
    }
    boost::filesystem::detail::directory_iterator_increment(&local_b0,(error_code *)0x0);
  } while( true );
}

Assistant:

bool slice_reader::open_file_case_insensitive(const path_type & dirname, const path_type & filename) {
	
	boost::filesystem::directory_iterator end;
	for(boost::filesystem::directory_iterator i(dirname); i != end; ++i) {
		path_type actual_filename = i->path().filename();
		if(boost::iequals(actual_filename.string(), filename.string()) && open_file(dirname / actual_filename)) {
			return true;
		}
	}
	
	return false;
}